

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall Assembler::instr2Bytes(Assembler *this,string *instrDescr,int regsDescr)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  value_type local_1e;
  value_type local_1d;
  int local_1c;
  string *psStack_18;
  int regsDescr_local;
  string *instrDescr_local;
  Assembler *this_local;
  
  local_1c = regsDescr;
  psStack_18 = instrDescr;
  instrDescr_local = &this->inputFileName;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->instrDescription,instrDescr);
  local_1d = (value_type)*pmVar2;
  std::vector<char,_std::allocator<char>_>::push_back(pmVar1,&local_1d);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  local_1e = (value_type)local_1c;
  std::vector<char,_std::allocator<char>_>::push_back(pmVar1,&local_1e);
  return;
}

Assistant:

void Assembler::instr2Bytes(string instrDescr, int regsDescr) {

    codeBySection[currentSectionName].push_back(instrDescription[instrDescr]);
    codeBySection[currentSectionName].push_back(regsDescr);

    return;
}